

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall Parser::traceIn(Parser *this,string *rname)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  RefCount<Token> local_40;
  long *local_38;
  long local_30;
  long local_28 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"enter ",6);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(rname->_M_dataplus)._M_p,rname->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"; LA(1)==",9);
  (*this->_vptr_Parser[5])(&local_40,this,1);
  (*(local_40.ref)->ptr->_vptr_Token[2])(&local_38);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_38,local_30);
  iVar1 = ((this->inputState).ref)->ptr->guessing;
  pcVar4 = "";
  if (0 < iVar1) {
    pcVar4 = " [guessing]";
  }
  lVar3 = 0xb;
  if (iVar1 < 1) {
    lVar3 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  RefCount<Token>::~RefCount(&local_40);
  return;
}

Assistant:

void Parser::traceIn(const std::string& rname)
{
	std::cout << "enter " << rname << "; LA(1)==" << LT(1)->getText() <<
			((inputState->guessing>0)?" [guessing]":"") << std::endl;
}